

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O2

void __thiscall
TPZMatrix<double>::SolveCG
          (TPZMatrix<double> *this,int64_t *numiterations,TPZSolver *preconditioner,
          TPZFMatrix<double> *F,TPZFMatrix<double> *result,TPZFMatrix<double> *residual,REAL *tol,
          int FromCurrent)

{
  TPZMatrixSolver<double> *M;
  
  M = (TPZMatrixSolver<double> *)
      __dynamic_cast(preconditioner,&TPZSolver::typeinfo,&TPZMatrixSolver<double>::typeinfo,0);
  if (M != (TPZMatrixSolver<double> *)0x0) {
    CG<TPZMatrix<double>,TPZFMatrix<double>,TPZMatrixSolver<double>,double>
              (this,result,F,M,residual,numiterations,tol,FromCurrent);
    return;
  }
  __cxa_bad_cast();
}

Assistant:

void TPZMatrix<TVar>::SolveCG(int64_t &numiterations, TPZSolver &preconditioner,
						const	TPZFMatrix<TVar> &F, TPZFMatrix<TVar> &result,
						TPZFMatrix<TVar> *residual, REAL &tol, const int FromCurrent) {
    if constexpr(std::is_floating_point<TVar>::value){
        TPZMatrixSolver<TVar> &precond = dynamic_cast<TPZMatrixSolver<TVar> &>(preconditioner);
        CG(*this, result, F, precond, residual, numiterations, tol, FromCurrent);
    }else{
        PZError<<__PRETTY_FUNCTION__<<" is currently not implemented ";
        PZError<<"for this type\nAborting...";
        DebugStop();
    }
}